

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleString_Contains_Test::~TEST_SimpleString_Contains_Test
          (TEST_SimpleString_Contains_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_00364eb8;
  MemoryLeakAllocator::~MemoryLeakAllocator
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator
              .super_TestMemoryAllocator);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, Contains)
{
    SimpleString s("hello!");
    SimpleString empty("");
    SimpleString beginning("hello");
    SimpleString end("lo!");
    SimpleString mid("l");
    SimpleString notPartOfString("xxxx");

    CHECK(s.contains(empty));
    CHECK(s.contains(beginning));
    CHECK(s.contains(end));
    CHECK(s.contains(mid));
    CHECK(!s.contains(notPartOfString));

    CHECK(empty.contains(empty));
    CHECK(!empty.contains(s));
}